

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDirWrapper.cpp
# Opt level: O0

QString * __thiscall
DataDirWrapper::getFieldName(QString *__return_storage_ptr__,DataDirWrapper *this,size_t fieldId)

{
  size_t fieldId_local;
  DataDirWrapper *this_local;
  
  switch(fieldId) {
  case 0:
    QString::QString(__return_storage_ptr__,"Export Directory");
    break;
  case 1:
    QString::QString(__return_storage_ptr__,"Import Directory");
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"Resource Directory");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"Exception Directory");
    break;
  case 4:
    QString::QString(__return_storage_ptr__,"Security Directory");
    break;
  case 5:
    QString::QString(__return_storage_ptr__,"Base Relocation Table");
    break;
  case 6:
    QString::QString(__return_storage_ptr__,"Debug Directory");
    break;
  case 7:
    QString::QString(__return_storage_ptr__,"Architecture Specific Data");
    break;
  case 8:
    QString::QString(__return_storage_ptr__,"RVA of GlobalPtr");
    break;
  case 9:
    QString::QString(__return_storage_ptr__,"TLS Directory");
    break;
  case 10:
    QString::QString(__return_storage_ptr__,"Load Configuration Directory");
    break;
  case 0xb:
    QString::QString(__return_storage_ptr__,"Bound Import Directory");
    break;
  case 0xc:
    QString::QString(__return_storage_ptr__,"Import Address Table");
    break;
  case 0xd:
    QString::QString(__return_storage_ptr__,"Delay Load Import Descriptors");
    break;
  case 0xe:
    QString::QString(__return_storage_ptr__,".NET header");
    break;
  default:
    QString::QString(__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

QString DataDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case pe::DIR_EXPORT: return "Export Directory";
        case pe::DIR_IMPORT: return "Import Directory";
        case pe::DIR_RESOURCE : return "Resource Directory";
        case pe::DIR_EXCEPTION: return "Exception Directory";
        case pe::DIR_SECURITY: return "Security Directory";
        case pe::DIR_BASERELOC: return "Base Relocation Table";
        case pe::DIR_DEBUG : return "Debug Directory";
        case pe::DIR_ARCHITECTURE: return "Architecture Specific Data";
        case pe::DIR_GLOBALPTR : return "RVA of GlobalPtr";
        case pe::DIR_TLS: return "TLS Directory";
        case pe::DIR_LOAD_CONFIG: return "Load Configuration Directory";
        case pe::DIR_BOUND_IMPORT: return "Bound Import Directory";
        case pe::DIR_IAT: return "Import Address Table";
        case pe::DIR_DELAY_IMPORT: return "Delay Load Import Descriptors";
        case pe::DIR_COM_DESCRIPTOR : return ".NET header";
    }
    return "";
}